

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_remove_entry(spki_table *spki_table,spki_record *spki_record)

{
  tommy_uint32_t hash_00;
  void *pvVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  int local_f4;
  int rtval;
  key_entry *rmv_elem;
  uint32_t hash;
  spki_record *spki_record_local;
  spki_table *spki_table_local;
  key_entry entry;
  
  entry.list_node._24_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_f4 = -1;
  spki_record_to_key_entry(spki_record,(key_entry *)&spki_table_local);
  hash_00 = tommy_inthash_u32(spki_record->asn);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  pvVar1 = tommy_hashlin_search(&spki_table->hashtable,spki_table->cmp_fp,&spki_table_local,hash_00)
  ;
  if (pvVar1 == (void *)0x0) {
    local_f4 = -3;
  }
  else {
    pvVar1 = tommy_hashlin_remove
                       (&spki_table->hashtable,spki_table->cmp_fp,&spki_table_local,hash_00);
    if ((pvVar1 != (void *)0x0) &&
       (pvVar2 = tommy_list_remove_existing(&spki_table->list,(tommy_node *)((long)pvVar1 + 0xa0)),
       pvVar2 != (void *)0x0)) {
      lrtr_free(pvVar1);
      spki_table_notify_clients(spki_table,spki_record,false);
      local_f4 = 0;
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != entry.list_node._24_8_) {
    __stack_chk_fail();
  }
  return local_f4;
}

Assistant:

int spki_table_remove_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry entry;
	struct key_entry *rmv_elem;
	int rtval = SPKI_ERROR;

	spki_record_to_key_entry(spki_record, &entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);

	if (!tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash)) {
		rtval = SPKI_RECORD_NOT_FOUND;
	} else {
		/* Remove from hashtable and list */
		rmv_elem = tommy_hashlin_remove(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash);
		if (rmv_elem && tommy_list_remove_existing(&spki_table->list, &rmv_elem->list_node)) {
			lrtr_free(rmv_elem);
			spki_table_notify_clients(spki_table, spki_record, false);
			rtval = SPKI_SUCCESS;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return rtval;
}